

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O2

int WritePPMPAM(FILE *fout,WebPDecBuffer *buffer,int alpha)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *__format;
  uint uVar4;
  uint8_t *__ptr;
  size_t __n;
  bool bVar5;
  
  iVar2 = 0;
  if (buffer != (WebPDecBuffer *)0x0 && fout != (FILE *)0x0) {
    __ptr = (buffer->u).RGBA.rgba;
    __n = 4 - (ulong)(alpha == 0);
    if (__ptr != (uint8_t *)0x0) {
      uVar4 = buffer->height;
      iVar2 = (buffer->u).RGBA.stride;
      uVar1 = buffer->width;
      __format = "P7\nWIDTH %u\nHEIGHT %u\nDEPTH 4\nMAXVAL 255\nTUPLTYPE RGB_ALPHA\nENDHDR\n";
      if (alpha == 0) {
        __format = "P6\n%u %u\n255\n";
      }
      fprintf((FILE *)fout,__format,(ulong)uVar1,(ulong)uVar4);
      while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
        sVar3 = fwrite(__ptr,(ulong)uVar1,__n,(FILE *)fout);
        if (sVar3 != __n) {
          return 0;
        }
        __ptr = __ptr + iVar2;
      }
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static int WritePPMPAM(FILE* fout, const WebPDecBuffer* const buffer,
                       int alpha) {
  if (fout == NULL || buffer == NULL) {
    return 0;
  } else {
    const uint32_t width = buffer->width;
    const uint32_t height = buffer->height;
    const uint8_t* row = buffer->u.RGBA.rgba;
    const int stride = buffer->u.RGBA.stride;
    const size_t bytes_per_px = alpha ? 4 : 3;
    uint32_t y;

    if (row == NULL) return 0;

    if (alpha) {
      fprintf(fout, "P7\nWIDTH %u\nHEIGHT %u\nDEPTH 4\nMAXVAL 255\n"
                    "TUPLTYPE RGB_ALPHA\nENDHDR\n", width, height);
    } else {
      fprintf(fout, "P6\n%u %u\n255\n", width, height);
    }
    for (y = 0; y < height; ++y) {
      if (fwrite(row, width, bytes_per_px, fout) != bytes_per_px) {
        return 0;
      }
      row += stride;
    }
  }
  return 1;
}